

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void aura_hexdump(char *desc,void *addr,int len)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  uchar buff [17];
  char acStack_48 [24];
  
  if (desc != (char *)0x0) {
    printf("%s:\n",desc);
  }
  if (0 < len) {
    uVar4 = 0;
    do {
      if ((uVar4 & 0xf) == 0) {
        if (uVar4 != 0) {
          printf("  %s\n",acStack_48);
        }
        printf("  %04x ",uVar4 & 0xffffffff);
      }
      printf(" %02x",(ulong)*(byte *)((long)addr + uVar4));
      cVar2 = *(char *)((long)addr + uVar4);
      if ((byte)(*(char *)((long)addr + uVar4) + 0x81U) < 0xa1) {
        cVar2 = '.';
      }
      acStack_48[(uint)uVar4 & 0xf] = cVar2;
      acStack_48[(uVar4 & 0xf) + 1] = '\0';
      uVar4 = uVar4 + 1;
    } while ((uint)len != uVar4);
    if ((len & 0xfU) != 0) {
      uVar3 = len + 1;
      do {
        printf("   ");
        uVar1 = uVar3 & 0xf;
        uVar3 = uVar3 + 1;
      } while (uVar1 != 0);
    }
  }
  printf("  %s\n",acStack_48);
  return;
}

Assistant:

void aura_hexdump(char *desc, void *addr, int len)
{
	int i;
	unsigned char buff[17];
	unsigned char *pc = (unsigned char *)addr;

	if (desc != NULL)
		printf("%s:\n", desc);

	for (i = 0; i < len; i++) {
		if ((i % 16) == 0) {
			if (i != 0)
				printf("  %s\n", buff);
			printf("  %04x ", i);
		}

		printf(" %02x", pc[i]);
		if ((pc[i] < 0x20) || (pc[i] > 0x7e))
			buff[i % 16] = '.';
		else
			buff[i % 16] = pc[i];
		buff[(i % 16) + 1] = '\0';
	}

	while ((i % 16) != 0) {
		printf("   ");
		i++;
	}

	printf("  %s\n", buff);
}